

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void duckdb::FlatVector::SetNull(Vector *vector,idx_t idx,bool is_null)

{
  PhysicalType PVar1;
  pointer puVar2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar3;
  type vector_00;
  Vector *vector_01;
  idx_t iVar4;
  idx_t idx_00;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *entry;
  pointer this;
  bool bVar5;
  
  TemplatedValidityMask<unsigned_long>::Set
            (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,idx,!is_null);
  if (is_null) {
    PVar1 = (vector->type).physical_type_;
    if (PVar1 == ARRAY) {
      vector_01 = ArrayVector::GetEntryInternal<duckdb::Vector>(vector);
      iVar4 = ArrayType::GetSize(&vector->type);
      idx_00 = idx * iVar4;
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 - 1, bVar5) {
        SetNull(vector_01,idx_00,true);
        idx_00 = idx_00 + 1;
      }
    }
    else if (PVar1 == STRUCT) {
      pvVar3 = StructVector::GetEntries(vector);
      puVar2 = (pvVar3->
               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this = (pvVar3->
                  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; this != puVar2; this = this + 1) {
        vector_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this);
        SetNull(vector_00,idx,true);
      }
    }
  }
  return;
}

Assistant:

void FlatVector::SetNull(Vector &vector, idx_t idx, bool is_null) {
	D_ASSERT(vector.GetVectorType() == VectorType::FLAT_VECTOR);
	vector.validity.Set(idx, !is_null);
	if (!is_null) {
		return;
	}

	auto &type = vector.GetType();
	auto internal_type = type.InternalType();

	// Set all child entries to NULL.
	if (internal_type == PhysicalType::STRUCT) {
		auto &entries = StructVector::GetEntries(vector);
		for (auto &entry : entries) {
			FlatVector::SetNull(*entry, idx, is_null);
		}
		return;
	}

	// Set all child entries to NULL.
	if (internal_type == PhysicalType::ARRAY) {
		auto &child = ArrayVector::GetEntry(vector);
		auto array_size = ArrayType::GetSize(type);
		auto child_offset = idx * array_size;
		for (idx_t i = 0; i < array_size; i++) {
			FlatVector::SetNull(child, child_offset + i, is_null);
		}
	}
}